

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_fillDoubleHashTable
               (ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm,
               ZSTD_tableFillPurpose_e tfp)

{
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  U32 *pUVar4;
  char cVar5;
  ulong uVar6;
  BYTE *pBVar7;
  ulong uVar8;
  uint uVar9;
  BYTE *pBVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  U32 *hashLarge;
  int iVar16;
  BYTE *pBVar17;
  bool bVar18;
  BYTE *iend;
  BYTE *base;
  U32 *hashSmall;
  int local_40;
  
  pBVar17 = (ms->window).base;
  uVar6 = (ulong)ms->nextToUpdate;
  pBVar10 = (BYTE *)((long)end - 8);
  pUVar3 = ms->hashTable;
  uVar1 = (ms->cParams).minMatch;
  pUVar4 = ms->chainTable;
  local_40 = (int)pBVar17;
  if (tfp == ZSTD_tfp_forCDict) {
    if (pBVar17 + uVar6 + 2 <= pBVar10) {
      uVar9 = (ms->cParams).chainLog;
      if (0x20 < uVar9 + 8) {
LAB_00173b3b:
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      uVar2 = (ms->cParams).hashLog;
      cVar5 = (char)uVar9;
      iVar12 = ms->nextToUpdate << 8;
      pBVar17 = pBVar17 + uVar6;
      do {
        uVar9 = (int)pBVar17 - local_40;
        uVar8 = uVar6;
        uVar15 = 0;
        iVar16 = iVar12;
        do {
          switch(uVar1) {
          case 5:
            lVar13 = -0x30e4432345000000;
            break;
          case 6:
            lVar13 = -0x30e4432340650000;
            break;
          case 7:
            lVar13 = -0x30e44323405a9d00;
            break;
          case 8:
            uVar14 = *(long *)(pBVar17 + uVar15) * -0x30e44323485a9b9d;
            goto LAB_001738dd;
          default:
            uVar14 = (ulong)((uint)(*(int *)(pBVar17 + uVar15) * -0x61c8864f) >>
                            (0x18U - cVar5 & 0x1f));
            goto LAB_001738e2;
          }
          uVar14 = lVar13 * *(long *)(pBVar17 + uVar15);
LAB_001738dd:
          uVar14 = uVar14 >> (0x38U - cVar5 & 0x3f);
LAB_001738e2:
          if (0x20 < uVar2 + 8) goto LAB_00173b3b;
          uVar11 = (ulong)(*(long *)(pBVar17 + uVar15) * -0x30e44323485a9b9d) >>
                   (0x38U - (char)uVar2 & 0x3f);
          if (uVar15 == 0) {
            if (0xffffff < uVar9) goto LAB_00173b5a;
            pUVar4[uVar14 >> 8] = (uint)uVar14 & 0xff | uVar9 * 0x100;
LAB_0017395d:
            if (0xffffff < (uint)uVar8) {
LAB_00173b5a:
              __assert_fail("index >> (32 - ZSTD_SHORT_CACHE_TAG_BITS) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x494f,"void ZSTD_writeTaggedIndex(U32 *const, size_t, U32)");
            }
            pUVar3[uVar11 >> 8] = ((uint)uVar11 & 0xff) + iVar16;
          }
          else if (pUVar3[uVar11 >> 8] == 0) goto LAB_0017395d;
          if (dtlm == ZSTD_dtlm_fast) break;
          iVar16 = iVar16 + 0x100;
          uVar8 = (ulong)((uint)uVar8 + 1);
          bVar18 = uVar15 < 2;
          uVar15 = uVar15 + 1;
        } while (bVar18);
        pBVar7 = pBVar17 + 5;
        iVar12 = iVar12 + 0x300;
        uVar6 = (ulong)((int)uVar6 + 3);
        pBVar17 = pBVar17 + 3;
      } while (pBVar7 <= pBVar10);
    }
  }
  else if (pBVar17 + uVar6 + 2 <= pBVar10) {
    uVar9 = (ms->cParams).chainLog;
    if (0x20 < uVar9) goto LAB_00173b3b;
    uVar2 = (ms->cParams).hashLog;
    cVar5 = (char)uVar9;
    pBVar17 = pBVar17 + uVar6;
    do {
      uVar8 = 0;
      uVar15 = uVar6;
      do {
        switch(uVar1) {
        case 5:
          uVar14 = *(long *)(pBVar17 + uVar8) * -0x30e4432345000000;
          break;
        case 6:
          uVar14 = *(long *)(pBVar17 + uVar8) * -0x30e4432340650000;
          break;
        case 7:
          uVar14 = *(long *)(pBVar17 + uVar8) * -0x30e44323405a9d00;
          break;
        case 8:
          uVar14 = *(long *)(pBVar17 + uVar8) * -0x30e44323485a9b9d;
          break;
        default:
          uVar14 = (ulong)((uint)(*(int *)(pBVar17 + uVar8) * -0x61c8864f) >> (0x20U - cVar5 & 0x1f)
                          );
          goto LAB_00173ab1;
        }
        uVar14 = uVar14 >> (0x40U - cVar5 & 0x3f);
LAB_00173ab1:
        if (0x20 < uVar2) goto LAB_00173b3b;
        uVar11 = (ulong)(*(long *)(pBVar17 + uVar8) * -0x30e44323485a9b9d) >>
                 (0x40U - (char)uVar2 & 0x3f);
        if (uVar8 == 0) {
          pUVar4[uVar14] = (int)pBVar17 - local_40;
LAB_00173ae0:
          pUVar3[uVar11] = (U32)uVar15;
        }
        else if (pUVar3[uVar11] == 0) goto LAB_00173ae0;
        if (dtlm == ZSTD_dtlm_fast) break;
        uVar15 = (ulong)((U32)uVar15 + 1);
        bVar18 = uVar8 < 2;
        uVar8 = uVar8 + 1;
      } while (bVar18);
      pBVar7 = pBVar17 + 5;
      uVar6 = (ulong)((int)uVar6 + 3);
      pBVar17 = pBVar17 + 3;
    } while (pBVar7 <= pBVar10);
  }
  return;
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm,
                        ZSTD_tableFillPurpose_e tfp)
{
    if (tfp == ZSTD_tfp_forCDict) {
        ZSTD_fillDoubleHashTableForCDict(ms, end, dtlm);
    } else {
        ZSTD_fillDoubleHashTableForCCtx(ms, end, dtlm);
    }
}